

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O1

CURLMcode mev_assess(Curl_multi *multi,Curl_easy *data,connectdata *conn)

{
  curl_multi_ev *h;
  uint uVar1;
  curl_trc_feat *pcVar2;
  connectdata *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  CURLMcode CVar6;
  uint uVar7;
  curl_socket_t *pcVar8;
  curl_socket_t *meta_data;
  mev_sh_entry *pmVar9;
  void *pvVar10;
  ulong uVar11;
  CURLMcode extraout_EDX;
  CURLMcode extraout_EDX_00;
  CURLMcode extraout_EDX_01;
  CURLMcode extraout_EDX_02;
  CURLMcode extraout_EDX_03;
  CURLMcode extraout_EDX_04;
  int iVar12;
  ulong uVar13;
  uchar last_action;
  char *fmt;
  mev_sh_entry *entry;
  Curl_hash *h_00;
  easy_pollset *ps_1;
  bool bVar14;
  undefined1 auVar15 [12];
  easy_pollset ps;
  uint local_80;
  CURLMcode local_7c;
  Curl_hash *local_78;
  Curl_multi *local_70;
  connectdata *local_68;
  uint local_5c;
  easy_pollset local_58;
  ulong local_38;
  
  if (multi == (Curl_multi *)0x0) {
    return CURLM_OK;
  }
  if (multi->socket_cb == (curl_socket_callback)0x0) {
    return CURLM_OK;
  }
  local_58.sockets[4] = 0;
  local_58.num = 0;
  local_58.actions[0] = '\0';
  local_58.actions[1] = '\0';
  local_58.actions[2] = '\0';
  local_58.actions[3] = '\0';
  local_58.actions[4] = '\0';
  local_58._29_3_ = 0;
  local_58.sockets[0] = 0;
  local_58.sockets[1] = 0;
  local_58.sockets[2] = 0;
  local_58.sockets[3] = 0;
  if (conn == (connectdata *)0x0) {
    CVar6 = CURLM_OK;
    if (data != (Curl_easy *)0x0) {
      Curl_multi_getsock(data,&local_58,"ev assess");
      CVar6 = extraout_EDX_00;
    }
  }
  else {
    Curl_conn_adjust_pollset(data,conn,&local_58);
    CVar6 = extraout_EDX;
  }
  local_70 = multi;
  if (data == (Curl_easy *)0x0) {
    pcVar8 = (curl_socket_t *)0x0;
  }
  else if (conn == (connectdata *)0x0) {
    pcVar8 = (curl_socket_t *)Curl_meta_get(data,"meta:mev:ps");
    CVar6 = extraout_EDX_02;
  }
  else {
    pcVar8 = (curl_socket_t *)Curl_conn_meta_get(conn,"meta:mev:ps");
    CVar6 = extraout_EDX_01;
  }
  if ((pcVar8 == (curl_socket_t *)0x0) && (local_58.num != 0)) {
    auVar15 = (undefined1  [12])(*Curl_ccalloc)(1,0x20);
    CVar6 = auVar15._8_4_;
    meta_data = auVar15._0_8_;
    if (conn == (connectdata *)0x0) {
      if (meta_data != (curl_socket_t *)0x0) {
        CVar5 = Curl_meta_set(data,"meta:mev:ps",meta_data,mev_pollset_dtor);
        CVar6 = extraout_EDX_04;
        goto LAB_0014c1b4;
      }
LAB_0014c1bf:
      pcVar8 = (curl_socket_t *)0x0;
    }
    else {
      if (meta_data == (curl_socket_t *)0x0) goto LAB_0014c1bf;
      CVar5 = Curl_conn_meta_set(conn,"meta:mev:ps",meta_data,mev_pollset_dtor);
      CVar6 = extraout_EDX_03;
LAB_0014c1b4:
      pcVar8 = (curl_socket_t *)0x0;
      if (CVar5 == CURLE_OK) {
        pcVar8 = meta_data;
      }
    }
    if (pcVar8 != (curl_socket_t *)0x0) goto LAB_0014c1cb;
    local_7c = CURLM_OUT_OF_MEMORY;
  }
  else {
LAB_0014c1cb:
    if (pcVar8 == (curl_socket_t *)0x0) {
      bVar14 = true;
      goto LAB_0014c724;
    }
    local_68 = conn;
    if (local_58.num != 0) {
      h = &local_70->ev;
      local_78 = (Curl_hash *)0x17e352;
      if (conn == (connectdata *)0x0) {
        local_78 = (Curl_hash *)0x17d787;
      }
      uVar13 = 0;
      do {
        pcVar3 = local_68;
        uVar1 = local_58.sockets[uVar13];
        local_80 = uVar1;
        if (uVar1 == 0xffffffff) {
          pmVar9 = (mev_sh_entry *)0x0;
        }
        else {
          pmVar9 = (mev_sh_entry *)Curl_hash_pick(&h->sh_entries,&local_80,4);
        }
        if (pmVar9 == (mev_sh_entry *)0x0) {
          local_5c = uVar1;
          if (uVar1 == 0xffffffff) {
            pmVar9 = (mev_sh_entry *)0x0;
            local_80 = uVar1;
          }
          else {
            local_80 = uVar1;
            pmVar9 = (mev_sh_entry *)Curl_hash_pick(&h->sh_entries,&local_80,4);
          }
          if (pmVar9 == (mev_sh_entry *)0x0) {
            pmVar9 = (mev_sh_entry *)(*Curl_ccalloc)(1,0x50);
            if (pmVar9 != (mev_sh_entry *)0x0) {
              Curl_uint_spbset_init((uint_spbset *)pmVar9);
              pvVar10 = Curl_hash_add(&h->sh_entries,&local_5c,4,pmVar9);
              if (pvVar10 != (void *)0x0) goto LAB_0014c2f0;
              Curl_uint_spbset_destroy((uint_spbset *)pmVar9);
              (*Curl_cfree)(pmVar9);
            }
            pmVar9 = (mev_sh_entry *)0x0;
          }
LAB_0014c2f0:
          if (pmVar9 != (mev_sh_entry *)0x0) {
            bVar14 = true;
            if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_multi.log_level)) {
              Curl_trc_multi(data,"ev new entry fd=%d",(ulong)uVar1);
            }
            goto LAB_0014c344;
          }
          goto LAB_0014c3a7;
        }
        if (pcVar3 == (connectdata *)0x0) {
          _Var4 = Curl_uint_spbset_contains(&pmVar9->xfers,data->mid);
          bVar14 = !_Var4;
        }
        else {
          bVar14 = pmVar9->conn != pcVar3;
        }
LAB_0014c344:
        if (!bVar14) {
          if ((ulong)(uint)pcVar8[5] != 0) {
            uVar11 = 0;
            do {
              if (uVar1 == pcVar8[uVar11]) {
                last_action = *(uchar *)((long)pcVar8 + uVar11 + 0x18);
                goto LAB_0014c3b5;
              }
              uVar11 = uVar11 + 1;
            } while ((uint)pcVar8[5] != uVar11);
          }
          goto LAB_0014c3a3;
        }
        if (local_68 == (connectdata *)0x0) {
          _Var4 = Curl_uint_spbset_add(&pmVar9->xfers,data->mid);
          if (_Var4) goto LAB_0014c390;
LAB_0014c3a7:
          local_7c = CURLM_OUT_OF_MEMORY;
          bVar14 = false;
        }
        else {
          if (pmVar9->conn != (connectdata *)0x0) goto LAB_0014c3a7;
          pmVar9->conn = local_68;
LAB_0014c390:
          if ((data == (Curl_easy *)0x0) || (((data->set).field_0x89f & 0x40) == 0)) {
LAB_0014c3a3:
            last_action = '\0';
          }
          else {
            pcVar2 = (data->state).feat;
            if (pcVar2 == (curl_trc_feat *)0x0) {
              if (Curl_trc_feat_multi.log_level < 1) goto LAB_0014c3a3;
            }
            else {
              last_action = '\0';
              if ((pcVar2->log_level < 1) || (Curl_trc_feat_multi.log_level < 1)) goto LAB_0014c3b5;
            }
            if (local_68 == (connectdata *)0x0) {
              local_38 = (ulong)data->mid;
            }
            else {
              local_38 = local_68->connection_id;
            }
            uVar7 = Curl_uint_spbset_count(&pmVar9->xfers);
            last_action = '\0';
            Curl_trc_multi(data,"ev entry fd=%d, added %s #%ld, total=%u/%d (xfer/conn)",
                           (ulong)uVar1,local_78,local_38,(ulong)uVar7,
                           (uint)(pmVar9->conn != (connectdata *)0x0));
          }
LAB_0014c3b5:
          CVar6 = mev_sh_entry_update(local_70,data,pmVar9,uVar1,last_action,
                                      local_58.actions[uVar13]);
          bVar14 = CVar6 == CURLM_OK;
          if (!bVar14) {
            local_7c = CVar6;
          }
        }
        if (!bVar14) goto LAB_0014c722;
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)local_58._16_8_ >> 0x20);
    }
    if (pcVar8[5] != 0) {
      h_00 = &(local_70->ev).sh_entries;
      uVar13 = 0;
      local_78 = h_00;
      do {
        uVar1 = pcVar8[uVar13];
        if ((ulong)local_58._16_8_ >> 0x20 != 0) {
          uVar11 = 0;
          do {
            if (uVar1 == local_58.sockets[uVar11]) {
              iVar12 = 0x12;
              goto LAB_0014c6ea;
            }
            uVar11 = uVar11 + 1;
          } while ((ulong)local_58._16_8_ >> 0x20 != uVar11);
        }
        local_80 = uVar1;
        if (uVar1 == 0xffffffff) {
          pmVar9 = (mev_sh_entry *)0x0;
        }
        else {
          pmVar9 = (mev_sh_entry *)Curl_hash_pick(h_00,&local_80,4);
        }
        iVar12 = 0x12;
        if (pmVar9 != (mev_sh_entry *)0x0) {
          if (local_68 == (connectdata *)0x0) {
            _Var4 = Curl_uint_spbset_contains(&pmVar9->xfers,data->mid);
            if (_Var4) {
              Curl_uint_spbset_remove(&pmVar9->xfers,data->mid);
              h_00 = local_78;
              goto LAB_0014c5ae;
            }
            h_00 = local_78;
            if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_multi.log_level)) {
              fmt = "ev entry fd=%d, transfer lost interest but is not registered";
              goto LAB_0014c6e0;
            }
          }
          else if (pmVar9->conn == local_68) {
            pmVar9->conn = (connectdata *)0x0;
LAB_0014c5ae:
            uVar7 = Curl_uint_spbset_count(&pmVar9->xfers);
            if (uVar7 == -(uint)(pmVar9->conn != (connectdata *)0x0)) {
              CVar6 = mev_forget_socket(local_70,data,uVar1,"last user gone");
              if (CVar6 != CURLM_OK) {
LAB_0014c60e:
                iVar12 = 1;
                local_7c = CVar6;
                goto LAB_0014c6ea;
              }
            }
            else {
              CVar6 = mev_sh_entry_update(local_70,data,pmVar9,uVar1,
                                          *(uchar *)((long)pcVar8 + uVar13 + 0x18),'\0');
              if (CVar6 != CURLM_OK) goto LAB_0014c60e;
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                   (0 < pcVar2->log_level)) && (0 < Curl_trc_feat_multi.log_level)))) {
                uVar7 = Curl_uint_spbset_count(&pmVar9->xfers);
                Curl_trc_multi(data,"ev entry fd=%d, removed transfer, total=%u/%d (xfer/conn)",
                               (ulong)uVar1,(ulong)uVar7,(ulong)(pmVar9->conn != (connectdata *)0x0)
                              );
              }
            }
            iVar12 = 0;
          }
          else if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                   ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_multi.log_level)) {
            fmt = "ev entry fd=%d, conn lost interest but is not registered";
LAB_0014c6e0:
            Curl_trc_multi(data,fmt,(ulong)uVar1);
          }
        }
LAB_0014c6ea:
        if ((iVar12 != 0x12) && (iVar12 != 0)) {
          bVar14 = false;
          CVar6 = local_7c;
          goto LAB_0014c724;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (uint)pcVar8[5]);
    }
    *(undefined8 *)(pcVar8 + 4) = local_58._16_8_;
    *(undefined8 *)(pcVar8 + 6) = local_58._24_8_;
    *(undefined8 *)pcVar8 = local_58.sockets._0_8_;
    *(undefined8 *)(pcVar8 + 2) = local_58.sockets._8_8_;
    local_7c = CURLM_OK;
  }
LAB_0014c722:
  bVar14 = false;
  CVar6 = local_7c;
LAB_0014c724:
  if (bVar14) {
    return CURLM_OK;
  }
  return CVar6;
}

Assistant:

static CURLMcode mev_assess(struct Curl_multi *multi,
                            struct Curl_easy *data,
                            struct connectdata *conn)
{
  if(multi && multi->socket_cb) {
    struct easy_pollset ps, *last_ps;

    mev_init_cur_pollset(&ps, data, conn);
    last_ps = mev_get_last_pollset(data, conn);

    if(!last_ps && ps.num) {
      if(conn)
        last_ps = mev_add_new_conn_pollset(conn);
      else
        last_ps = mev_add_new_xfer_pollset(data);
      if(!last_ps)
        return CURLM_OUT_OF_MEMORY;
    }

    if(last_ps)
      return mev_pollset_diff(multi, data, conn, &ps, last_ps);
    else
      DEBUGASSERT(!ps.num);
  }
  return CURLM_OK;
}